

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O3

bool __thiscall
ASDCP::MXF::
FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
::Unarchive(FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
            *this,MemIOReader *Reader)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  value_type tmp_item;
  DeltaEntry local_40;
  
  uVar5 = Reader->m_size;
  if ((ulong)uVar5 + 4 <= (ulong)Reader->m_capacity) {
    uVar1 = *(uint *)(Reader->m_p + uVar5);
    uVar4 = uVar5 + 4;
    Reader->m_size = uVar4;
    if ((ulong)uVar4 + 4 <= (ulong)Reader->m_capacity) {
      iVar2 = *(int *)(Reader->m_p + uVar4);
      bVar3 = iVar2 == 0x6000000 || uVar1 == 0;
      Reader->m_size = uVar5 + 8;
      if (uVar1 == 0) {
        return bVar3;
      }
      if (iVar2 != 0x6000000) {
        return bVar3;
      }
      uVar5 = 1;
      while( true ) {
        local_40.super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00222bc0;
        local_40.PosTableIndex = '\0';
        local_40.Slice = '\0';
        local_40.ElementData = 0;
        bVar3 = IndexTableSegment::DeltaEntry::Unarchive(&local_40,Reader);
        if (!bVar3) break;
        std::
        vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
        ::push_back(&this->
                     super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                    ,&local_40);
        bVar6 = (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) <=
                uVar5;
        uVar5 = uVar5 + 1;
        if (!bVar3 || bVar6) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Unarchive(Kumu::MemIOReader* Reader) {
	    ui32_t item_count, item_size;
	    if ( ! Reader->ReadUi32BE(&item_count) ) return false;
	    if ( ! Reader->ReadUi32BE(&item_size) ) return false;

	    if ( item_count > 0 )
	      {
		if ( this->ItemSize() != item_size ) return false;
	      }

	    bool result = true;
	    for ( ui32_t i = 0; i < item_count && result; ++i )
	      {
		typename ContainerType::value_type tmp_item;
		result = tmp_item.Unarchive(Reader);

		if ( result )
		  {
		    this->push_back(tmp_item);
		  }
	      }

	    return result;
	  }